

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

void __thiscall
GlobOpt::CaptureValuesFromScratch
          (GlobOpt *this,BasicBlock *block,EditingIterator *bailOutConstValuesIter,
          EditingIterator *bailOutCopySymsIter,BVSparse<Memory::JitArenaAllocator> *argsToCapture)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Type pJVar2;
  Type pBVar3;
  ValueInfo *pVVar4;
  Sym *pSVar5;
  StackSym *param1;
  Value *val;
  code *pcVar6;
  int iVar7;
  bool bVar8;
  undefined4 *puVar9;
  Type *pTVar10;
  HashBucket *pHVar11;
  VarConstantValueInfo *pVVar12;
  Type_conflict pBVar13;
  ulong uVar14;
  long *plVar15;
  JitArenaAllocator *allocator;
  Type_conflict pBVar16;
  ulong uVar18;
  ulong uVar19;
  GlobHashTable *pGVar20;
  BailoutConstantValue param2;
  int local_5c;
  BVSparse<Memory::JitArenaAllocator> *pBStack_58;
  int intConstantValue;
  GlobOpt *local_50;
  undefined1 local_48 [8];
  BailoutConstantValue constValue;
  anon_union_8_3_5e50e90d_for_u aVar17;
  
  pBVar1 = (block->globOptData).changedSyms;
  if (pBVar1->head != (Type_conflict)0x0) {
    pJVar2 = pBVar1->alloc;
    pBVar3 = pBVar1->head;
    pBVar16 = pJVar2->bvFreeList;
    do {
      pBVar13 = pBVar3;
      pBVar3 = pBVar13->next;
      pBVar13->next = pBVar16;
      pBVar16 = pBVar13;
    } while (pBVar3 != (Type)0x0);
    pJVar2->bvFreeList = pBVar13;
  }
  pBVar1->head = (Type_conflict)0x0;
  pBVar1->lastFoundIndex = (Type_conflict)0x0;
  pBVar1->lastUsedNodePrevNextField = &pBVar1->head;
  pGVar20 = (block->globOptData).symToValueMap;
  pBStack_58 = argsToCapture;
  local_50 = this;
  constValue.u = (anon_union_8_3_5e50e90d_for_u)block;
  if (pGVar20->tableSize != 0) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar18 = 0;
    do {
      local_48 = (undefined1  [8])(pGVar20->table + uVar18);
      constValue._0_8_ = local_48;
      while( true ) {
        if (constValue._0_8_ == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar8) goto LAB_00488639;
          *puVar9 = 0;
        }
        if ((undefined1  [8])
            *(SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> **)
             constValue._0_8_ == local_48) break;
        constValue._0_8_ =
             *(SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> **)
              constValue._0_8_;
        pTVar10 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_48);
        pVVar4 = pTVar10->element->valueInfo;
        if ((((pVVar4->symStore != (Sym *)0x0) ||
             (bVar8 = ValueInfo::HasIntConstantValue(pVVar4,false), bVar8)) &&
            (pSVar5 = pTVar10->value, pSVar5 != (Sym *)0x0)) &&
           ((pSVar5->m_kind == SymKindStack && (((ulong)pSVar5[1]._vptr_Sym & 0x2000) != 0)))) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (*(BVSparse<Memory::JitArenaAllocator> **)((long)constValue.u + 0x188),
                     pSVar5->m_id);
        }
      }
      uVar18 = uVar18 + 1;
      pGVar20 = *(GlobHashTable **)((long)constValue.u + 0xd0);
    } while (uVar18 < pGVar20->tableSize);
  }
  aVar17 = constValue.u;
  if (pBStack_58 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (*(BVSparse<Memory::JitArenaAllocator> **)((long)constValue.u + 0x188),pBStack_58);
  }
  plVar15 = (long *)**(long **)((long)aVar17 + 0x188);
  if (plVar15 != (long *)0x0) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar18 = plVar15[2];
      if (uVar18 != 0) {
        pBStack_58 = (BVSparse<Memory::JitArenaAllocator> *)(ulong)*(uint *)(plVar15 + 1);
        uVar19 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
          }
        }
        do {
          iVar7 = (int)pBStack_58;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar19);
          pHVar11 = ValueHashTable<Sym_*,_Value_*>::GetBucket
                              (*(ValueHashTable<Sym_*,_Value_*> **)((long)aVar17 + 0xd0),
                               iVar7 + (BVIndex)uVar19);
          param1 = (StackSym *)pHVar11->value;
          if ((param1->super_Sym).m_kind != SymKindStack) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar8) {
LAB_00488639:
              pcVar6 = (code *)invalidInstructionException();
              (*pcVar6)();
            }
            *puVar9 = 0;
          }
          val = pHVar11->element;
          pVVar4 = val->valueInfo;
          bVar8 = ValueInfo::TryGetIntConstantValue(pVVar4,&local_5c,false);
          if (bVar8) {
            allocator = local_50->func->m_alloc;
            uVar14 = 3;
            aVar17 = (anon_union_8_3_5e50e90d_for_u)(long)local_5c;
LAB_004885ea:
            param2.u = aVar17;
            param2._0_8_ = uVar14;
            SListBase<JsUtil::KeyValuePair<StackSym*,BailoutConstantValue>,Memory::ArenaAllocator,RealCount>
            ::EditingIterator::InsertNodeBefore<StackSym*,BailoutConstantValue>
                      ((EditingIterator *)bailOutConstValuesIter,&allocator->super_ArenaAllocator,
                       param1,param2);
          }
          else {
            bVar8 = ValueInfo::IsVarConstant(pVVar4);
            if (bVar8) {
              pVVar12 = ValueInfo::AsVarConstant(pVVar4);
              BailoutConstantValue::InitVarConstValue
                        ((BailoutConstantValue *)local_48,pVVar12->varValue);
              allocator = local_50->func->m_alloc;
              uVar14 = (ulong)local_48 & 0xffffffff;
              aVar17 = (anon_union_8_3_5e50e90d_for_u)constValue._0_8_;
              goto LAB_004885ea;
            }
            CaptureCopyPropValue
                      (local_50,(BasicBlock *)constValue.u,(Sym *)param1,val,bailOutCopySymsIter);
          }
          uVar18 = uVar18 & ~(1L << (uVar19 & 0x3f));
          uVar19 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          aVar17 = constValue.u;
        } while (uVar18 != 0);
      }
      plVar15 = (long *)*plVar15;
    } while (plVar15 != (long *)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureValuesFromScratch(BasicBlock * block,
    SListBase<ConstantStackSymValue>::EditingIterator & bailOutConstValuesIter,
    SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter,
    BVSparse<JitArenaAllocator>* argsToCapture)
{
    Sym * sym = nullptr;
    Value * value = nullptr;
    ValueInfo * valueInfo = nullptr;

    block->globOptData.changedSyms->ClearAll();

    FOREACH_VALUEHASHTABLE_ENTRY(GlobHashBucket, bucket, block->globOptData.symToValueMap)
    {
        value = bucket.element;
        valueInfo = value->GetValueInfo();

        if (valueInfo->GetSymStore() == nullptr && !valueInfo->HasIntConstantValue())
        {
            continue;
        }

        sym = bucket.value;
        if (sym == nullptr || !sym->IsStackSym() || !(sym->AsStackSym()->HasByteCodeRegSlot()))
        {
            continue;
        }
        block->globOptData.changedSyms->Set(sym->m_id);
    }
    NEXT_VALUEHASHTABLE_ENTRY;

    if (argsToCapture)
    {
        block->globOptData.changedSyms->Or(argsToCapture);
    }

    FOREACH_BITSET_IN_SPARSEBV(symId, block->globOptData.changedSyms)
    {
        HashBucket<Sym*, Value*> * bucket = block->globOptData.symToValueMap->GetBucket(symId);
        StackSym * stackSym = bucket->value->AsStackSym();
        value =  bucket->element;
        valueInfo = value->GetValueInfo();

        int intConstantValue;
        if (valueInfo->TryGetIntConstantValue(&intConstantValue))
        {
            BailoutConstantValue constValue;
            constValue.InitIntConstValue(intConstantValue);
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, stackSym, constValue);
        }
        else if (valueInfo->IsVarConstant())
        {
            BailoutConstantValue constValue;
            constValue.InitVarConstValue(valueInfo->AsVarConstant()->VarValue());
            bailOutConstValuesIter.InsertNodeBefore(this->func->m_alloc, stackSym, constValue);
        }
        else
        {
            CaptureCopyPropValue(block, stackSym, value, bailOutCopySymsIter);
        }
    }
    NEXT_BITSET_IN_SPARSEBV
}